

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::HlslParseContext::fixBlockUniformOffsets
          (HlslParseContext *this,TQualifier *qualifier,TTypeList *typeList)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  pointer pTVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar7;
  undefined4 extraout_var_01;
  int powerOf2;
  ulong uVar8;
  int offset;
  int memberSize;
  int dummyStride;
  int local_54;
  TQualifier *local_50;
  int local_44;
  HlslParseContext *local_40;
  int local_34;
  long lVar6;
  
  if ((((*(uint *)&qualifier->field_0x8 & 0x7f) - 5 < 2) &&
      (uVar2 = (byte)qualifier->field_0x10 & 0xf, uVar2 < 6)) && ((0x2cU >> uVar2 & 1) != 0)) {
    local_54 = 0;
    pTVar5 = (typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
             ).super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((typeList->super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
        super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>._M_impl.
        super__Vector_impl_data._M_finish != pTVar5) {
      uVar2 = 1;
      uVar8 = 0;
      local_50 = qualifier;
      local_40 = this;
      do {
        iVar3 = (*(pTVar5[uVar8].type)->_vptr_TType[10])();
        lVar6 = CONCAT44(extraout_var,iVar3);
        pTVar5 = (typeList->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        iVar3 = (*(pTVar5[uVar8].type)->_vptr_TType[10])();
        uVar7 = *(ulong *)(CONCAT44(extraout_var_00,iVar3) + 8);
        if (uVar7 < 0x2000000000000000) {
          uVar7 = *(ulong *)&local_50->field_0x8;
        }
        iVar4 = TIntermediate::getMemberAlignment
                          ((typeList->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ).
                           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar8].type,&local_44,&local_34
                           ,(byte)local_50->field_0x10 & 0xf,
                           (uVar7 & 0xe000000000000000) == 0x2000000000000000);
        iVar3 = local_54;
        if (*(int *)(lVar6 + 0x14) != -1) {
          bVar1 = IsMultipleOfPow2<int>(*(int *)(lVar6 + 0x14),iVar4);
          if (!bVar1) {
            (*(local_40->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (local_40,&pTVar5[uVar8].loc,"must be a multiple of the member\'s alignment",
                       "offset","(layout offset = %d | member alignment = %d)",
                       (ulong)*(uint *)(lVar6 + 0x14),iVar4);
          }
          iVar3 = *(int *)(lVar6 + 0x14);
          if (*(int *)(lVar6 + 0x14) < local_54) {
            iVar3 = local_54;
          }
        }
        local_54 = iVar3;
        iVar3 = *(int *)(lVar6 + 0x18);
        powerOf2 = iVar3;
        if (iVar3 < iVar4) {
          powerOf2 = iVar4;
        }
        if (iVar3 == -1) {
          powerOf2 = iVar4;
        }
        RoundToPow2<int>(&local_54,powerOf2);
        iVar3 = local_54;
        iVar4 = (*((typeList->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                   super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar8].type)->_vptr_TType[10])();
        *(int *)(CONCAT44(extraout_var_01,iVar4) + 0x14) = iVar3;
        local_54 = local_54 + local_44;
        uVar8 = (ulong)uVar2;
        pTVar5 = (typeList->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar2 = uVar2 + 1;
      } while (uVar8 < (ulong)((long)(typeList->
                                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                     ).
                                     super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar5 >> 5)
              );
    }
  }
  return;
}

Assistant:

void HlslParseContext::fixBlockUniformOffsets(const TQualifier& qualifier, TTypeList& typeList)
{
    if (! qualifier.isUniformOrBuffer())
        return;
    if (qualifier.layoutPacking != ElpStd140 && qualifier.layoutPacking != ElpStd430 && qualifier.layoutPacking != ElpScalar)
        return;

    int offset = 0;
    int memberSize;
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TQualifier& memberQualifier = typeList[member].type->getQualifier();
        const TSourceLoc& memberLoc = typeList[member].loc;

        // "When align is applied to an array, it effects only the start of the array, not the array's internal stride."

        // modify just the children's view of matrix layout, if there is one for this member
        TLayoutMatrix subMatrixLayout = typeList[member].type->getQualifier().layoutMatrix;
        int dummyStride;
        int memberAlignment = intermediate.getMemberAlignment(*typeList[member].type, memberSize, dummyStride,
                                                              qualifier.layoutPacking,
                                                              subMatrixLayout != ElmNone
                                                                  ? subMatrixLayout == ElmRowMajor
                                                                  : qualifier.layoutMatrix == ElmRowMajor);
        if (memberQualifier.hasOffset()) {
            // "The specified offset must be a multiple
            // of the base alignment of the type of the block member it qualifies, or a compile-time error results."
            if (! IsMultipleOfPow2(memberQualifier.layoutOffset, memberAlignment))
                error(memberLoc, "must be a multiple of the member's alignment", "offset",
                    "(layout offset = %d | member alignment = %d)", memberQualifier.layoutOffset, memberAlignment);

            // "The offset qualifier forces the qualified member to start at or after the specified
            // integral-constant expression, which will be its byte offset from the beginning of the buffer.
            // "The actual offset of a member is computed as
            // follows: If offset was declared, start with that offset, otherwise start with the next available offset."
            offset = std::max(offset, memberQualifier.layoutOffset);
        }

        // "The actual alignment of a member will be the greater of the specified align alignment and the standard
        // (e.g., std140) base alignment for the member's type."
        if (memberQualifier.hasAlign())
            memberAlignment = std::max(memberAlignment, memberQualifier.layoutAlign);

        // "If the resulting offset is not a multiple of the actual alignment,
        // increase it to the first offset that is a multiple of
        // the actual alignment."
        RoundToPow2(offset, memberAlignment);
        typeList[member].type->getQualifier().layoutOffset = offset;
        offset += memberSize;
    }
}